

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

aiMatrix4x4 * __thiscall
Assimp::ColladaParser::CalculateResultTransform
          (aiMatrix4x4 *__return_storage_ptr__,ColladaParser *this,
          vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
          *pTransforms)

{
  bool bVar1;
  reference pTVar2;
  aiVector3t<float> *paVar3;
  aiVector3t<float> aVar4;
  undefined1 local_214 [8];
  aiMatrix4x4 mat;
  aiMatrix4x4 scale;
  undefined1 local_188 [8];
  aiMatrix4x4 trans;
  aiVector3D axis;
  ai_real angle;
  aiMatrix4x4 rot;
  aiVector3t<float> local_b8;
  aiVector3t<float> local_a8;
  undefined8 local_9c;
  aiVector3D right;
  float local_88;
  aiVector3t<float> local_80;
  undefined1 local_70 [8];
  aiVector3D dir;
  undefined1 local_58 [8];
  aiVector3D up;
  aiVector3D dstPos;
  aiVector3D pos;
  Transform *tf;
  __normal_iterator<const_Assimp::Collada::Transform_*,_std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>_>
  local_20;
  const_iterator it;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> *pTransforms_local
  ;
  ColladaParser *this_local;
  
  it._M_current = (Transform *)pTransforms;
  aiMatrix4x4t<float>::aiMatrix4x4t(__return_storage_ptr__);
  local_20._M_current =
       (Transform *)
       std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::begin
                 (it._M_current);
  while( true ) {
    tf = (Transform *)
         std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::end
                   (it._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_Assimp::Collada::Transform_*,_std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>_>
                        *)&tf);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::Collada::Transform_*,_std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>_>
             ::operator*(&local_20);
    switch(pTVar2->mType) {
    case TF_LOOKAT:
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&dstPos.y,pTVar2->f[0],pTVar2->f[1],pTVar2->f[2]);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&up.z,pTVar2->f[3],pTVar2->f[4],pTVar2->f[5]);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&dir.y,pTVar2->f[6],pTVar2->f[7],pTVar2->f[8]);
      paVar3 = aiVector3t<float>::Normalize((aiVector3t<float> *)&dir.y);
      up.x = paVar3->z;
      local_58._0_4_ = paVar3->x;
      local_58._4_4_ = paVar3->y;
      aVar4 = ::operator-((aiVector3t<float> *)&up.z,(aiVector3t<float> *)&dstPos.y);
      local_88 = aVar4.z;
      local_80.z = local_88;
      right._4_8_ = aVar4._0_8_;
      local_80.x = right.y;
      local_80.y = right.z;
      unique0x100008a8 = aVar4;
      paVar3 = aiVector3t<float>::Normalize(&local_80);
      dir.x = paVar3->z;
      local_70._0_4_ = paVar3->x;
      local_70._4_4_ = paVar3->y;
      aVar4 = operator^((aiVector3t<float> *)local_70,(aiVector3t<float> *)local_58);
      local_b8._0_8_ = aVar4._0_8_;
      local_a8.x = local_b8.x;
      local_a8.y = local_b8.y;
      local_b8.z = aVar4.z;
      local_a8.z = local_b8.z;
      paVar3 = aiVector3t<float>::Normalize(&local_a8);
      local_9c._0_4_ = paVar3->x;
      local_9c._4_4_ = paVar3->y;
      right.x = paVar3->z;
      aiMatrix4x4t<float>::aiMatrix4x4t
                ((aiMatrix4x4t<float> *)&rot.d3,(float)(undefined4)local_9c,(float)local_58._0_4_,
                 -(float)local_70._0_4_,dstPos.y,(float)local_9c._4_4_,(float)local_58._4_4_,
                 -(float)local_70._4_4_,dstPos.z,right.x,up.x,-dir.x,pos.x,0.0,0.0,0.0,1.0);
      aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,(aiMatrix4x4t<float> *)&rot.d3);
      break;
    case TF_ROTATE:
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&axis.z);
      axis.y = (pTVar2->f[3] * 3.1415927) / 180.0;
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&trans.d3,pTVar2->f[0],pTVar2->f[1],pTVar2->f[2]);
      aiMatrix4x4t<float>::Rotation
                (axis.y,(aiVector3t<float> *)&trans.d3,(aiMatrix4x4t<float> *)&axis.z);
      aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,(aiMatrix4x4t<float> *)&axis.z);
      break;
    case TF_TRANSLATE:
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_188);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&scale.d3,pTVar2->f[0],pTVar2->f[1],pTVar2->f[2]);
      aiMatrix4x4t<float>::Translation
                ((aiVector3t<float> *)&scale.d3,(aiMatrix4x4t<float> *)local_188);
      aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,(aiMatrix4x4t<float> *)local_188);
      break;
    case TF_SCALE:
      aiMatrix4x4t<float>::aiMatrix4x4t
                ((aiMatrix4x4t<float> *)&mat.d3,pTVar2->f[0],0.0,0.0,0.0,0.0,pTVar2->f[1],0.0,0.0,
                 0.0,0.0,pTVar2->f[2],0.0,0.0,0.0,0.0,1.0);
      aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,(aiMatrix4x4t<float> *)&mat.d3);
      break;
    case TF_SKEW:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                    ,0xd75,
                    "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                   );
    case TF_MATRIX:
      aiMatrix4x4t<float>::aiMatrix4x4t
                ((aiMatrix4x4t<float> *)local_214,pTVar2->f[0],pTVar2->f[1],pTVar2->f[2],
                 pTVar2->f[3],pTVar2->f[4],pTVar2->f[5],pTVar2->f[6],pTVar2->f[7],pTVar2->f[8],
                 pTVar2->f[9],pTVar2->f[10],pTVar2->f[0xb],pTVar2->f[0xc],pTVar2->f[0xd],
                 pTVar2->f[0xe],pTVar2->f[0xf]);
      aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,(aiMatrix4x4t<float> *)local_214);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                    ,0xd7f,
                    "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::Collada::Transform_*,_std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>_>
    ::operator++(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 ColladaParser::CalculateResultTransform(const std::vector<Transform>& pTransforms) const
{
    aiMatrix4x4 res;

    for (std::vector<Transform>::const_iterator it = pTransforms.begin(); it != pTransforms.end(); ++it)
    {
        const Transform& tf = *it;
        switch (tf.mType)
        {
        case TF_LOOKAT:
        {
            aiVector3D pos(tf.f[0], tf.f[1], tf.f[2]);
            aiVector3D dstPos(tf.f[3], tf.f[4], tf.f[5]);
            aiVector3D up = aiVector3D(tf.f[6], tf.f[7], tf.f[8]).Normalize();
            aiVector3D dir = aiVector3D(dstPos - pos).Normalize();
            aiVector3D right = (dir ^ up).Normalize();

            res *= aiMatrix4x4(
                right.x, up.x, -dir.x, pos.x,
                right.y, up.y, -dir.y, pos.y,
                right.z, up.z, -dir.z, pos.z,
                0, 0, 0, 1);
            break;
        }
        case TF_ROTATE:
        {
            aiMatrix4x4 rot;
            ai_real angle = tf.f[3] * ai_real(AI_MATH_PI) / ai_real(180.0);
            aiVector3D axis(tf.f[0], tf.f[1], tf.f[2]);
            aiMatrix4x4::Rotation(angle, axis, rot);
            res *= rot;
            break;
        }
        case TF_TRANSLATE:
        {
            aiMatrix4x4 trans;
            aiMatrix4x4::Translation(aiVector3D(tf.f[0], tf.f[1], tf.f[2]), trans);
            res *= trans;
            break;
        }
        case TF_SCALE:
        {
            aiMatrix4x4 scale(tf.f[0], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[1], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[2], 0.0f,
                0.0f, 0.0f, 0.0f, 1.0f);
            res *= scale;
            break;
        }
        case TF_SKEW:
            // TODO: (thom)
            ai_assert(false);
            break;
        case TF_MATRIX:
        {
            aiMatrix4x4 mat(tf.f[0], tf.f[1], tf.f[2], tf.f[3], tf.f[4], tf.f[5], tf.f[6], tf.f[7],
                tf.f[8], tf.f[9], tf.f[10], tf.f[11], tf.f[12], tf.f[13], tf.f[14], tf.f[15]);
            res *= mat;
            break;
        }
        default:
            ai_assert(false);
            break;
        }
    }

    return res;
}